

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int mbedtls_ctr_drbg_update_ret(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t add_len)

{
  int iVar1;
  uchar add_input [48];
  uchar auStack_48 [56];
  
  if (add_len == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = block_cipher_df(auStack_48,additional,add_len);
    if (iVar1 == 0) {
      iVar1 = ctr_drbg_update_internal(ctx,auStack_48);
    }
    mbedtls_platform_zeroize(auStack_48,0x30);
  }
  return iVar1;
}

Assistant:

int mbedtls_ctr_drbg_update_ret( mbedtls_ctr_drbg_context *ctx,
                                 const unsigned char *additional,
                                 size_t add_len )
{
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( add_len == 0 )
        return( 0 );

    if( ( ret = block_cipher_df( add_input, additional, add_len ) ) != 0 )
        goto exit;
    if( ( ret = ctr_drbg_update_internal( ctx, add_input ) ) != 0 )
        goto exit;

exit:
    mbedtls_platform_zeroize( add_input, sizeof( add_input ) );
    return( ret );
}